

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppillr.cpp
# Opt level: O0

void __thiscall KeywordStats::print(KeywordStats *this)

{
  value_type_conflict2 vVar1;
  reference pvVar2;
  undefined8 uVar3;
  int local_14;
  int i;
  KeywordStats *this_local;
  
  for (local_14 = 0; local_14 < 0x51; local_14 = local_14 + 1) {
    pvVar2 = std::array<unsigned_long,_81UL>::operator[](&this->keywords,(long)local_14);
    if (*pvVar2 != 0) {
      pvVar2 = std::array<unsigned_long,_81UL>::operator[](&this->keywords,(long)local_14);
      vVar1 = *pvVar2;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&keywords_id_abi_cxx11_,(long)local_14);
      uVar3 = std::__cxx11::string::c_str();
      printf("%d\t%s\n",vVar1,uVar3);
    }
  }
  return;
}

Assistant:

void print() {
    for (int i=0; i<int(MaxKeyword); ++i) {
      if (keywords[i] > 0)
        std::printf("%d\t%s\n", keywords[i], keywords_id[i].c_str());
    }
  }